

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

iterator __thiscall mpt::span<const_int>::nth(span<const_int> *this,long pos)

{
  long lVar1;
  long local_20;
  long pos_local;
  span<const_int> *this_local;
  
  if (pos < 0) {
    local_20 = size(this);
    local_20 = local_20 + pos;
    if (local_20 < 0) {
      return (iterator)0x0;
    }
  }
  else {
    lVar1 = size(this);
    local_20 = pos;
    if (lVar1 <= pos) {
      return (iterator)0x0;
    }
  }
  return this->_base + local_20;
}

Assistant:

inline iterator nth(long pos) const
	{
		if (pos < 0) {
			if ((pos += size()) < 0) {
				return 0;
			}
		}
		else if (pos >= size()) {
			return 0;
		}
		return _base + pos;
	}